

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmDivl<(moira::Instr)154,(moira::Mode)9,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  bool bVar3;
  u32 ext_00;
  StrWriter *pSVar4;
  char *local_a0;
  Av<(moira::Instr)154,_(moira::Mode)9,_4> local_8c;
  int local_88;
  int local_84;
  int local_7c;
  int local_74;
  int local_6c;
  int local_64;
  int local_60;
  int local_58;
  char *local_50;
  char *fill;
  Dn dh;
  Dn dl;
  Ea<(moira::Mode)9,_4> src;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  ext_00 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)9,4>((Ea<(moira::Mode)9,_4> *)&dh,this,op & 7,addr);
  Dn::Dn((Dn *)((long)&fill + 4),ext_00 >> 0xc & 7);
  Dn::Dn((Dn *)&fill,ext_00 & 7);
  if ((str->style->syntax == GNU) || (str->style->syntax == GNU_MIT)) {
    local_a0 = ",";
  }
  else {
    local_a0 = ":";
  }
  local_50 = local_a0;
  SVar2 = str->style->syntax;
  if ((SVar2 != GNU && SVar2 != GNU_MIT) || (bVar3 = isValidExt(this,DIVL,DIPC,op,ext_00), bVar3)) {
    if ((ext_00 & 0x800) == 0) {
      StrWriter::operator<<(str);
    }
    else {
      StrWriter::operator<<(str);
    }
    if ((ext_00 & 0x400) == 0) {
      if ((fill._4_4_ == fill._0_4_) && (str->style->syntax == MUSASHI)) {
        pSVar4 = StrWriter::operator<<(str);
        local_6c = (str->tab).raw;
        pSVar4 = StrWriter::operator<<(pSVar4,(Tab)local_6c);
        pSVar4 = StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)9,_4> *)&dh);
        pSVar4 = StrWriter::operator<<(pSVar4);
        local_74 = fill._0_4_;
        StrWriter::operator<<(pSVar4,fill._0_4_);
      }
      else {
        pSVar4 = StrWriter::operator<<(str,"l");
        pSVar4 = StrWriter::operator<<(pSVar4);
        local_7c = (str->tab).raw;
        pSVar4 = StrWriter::operator<<(pSVar4,(Tab)local_7c);
        pSVar4 = StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)9,_4> *)&dh);
        pSVar4 = StrWriter::operator<<(pSVar4);
        local_84 = fill._0_4_;
        pSVar4 = StrWriter::operator<<(pSVar4,fill._0_4_);
        pSVar4 = StrWriter::operator<<(pSVar4,local_50);
        local_88 = fill._4_4_;
        StrWriter::operator<<(pSVar4,fill._4_4_);
      }
    }
    else {
      pSVar4 = StrWriter::operator<<(str);
      local_58 = (str->tab).raw;
      pSVar4 = StrWriter::operator<<(pSVar4,(Tab)local_58);
      pSVar4 = StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)9,_4> *)&dh);
      pSVar4 = StrWriter::operator<<(pSVar4);
      local_60 = fill._0_4_;
      pSVar4 = StrWriter::operator<<(pSVar4,fill._0_4_);
      pSVar4 = StrWriter::operator<<(pSVar4,local_50);
      local_64 = fill._4_4_;
      StrWriter::operator<<(pSVar4,fill._4_4_);
    }
    local_8c.ext1 = 0;
    StrWriter::operator<<(str,&local_8c);
  }
  else {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)154,(moira::Mode)9,4>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmDivl(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::DIVS>{} : str << Ins<Instr::DIVU>{};

            if (ext & 1 << 10) {

                // DIVS.L <ea>,Dr:Dq    (64-bit dividend)
                str << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

            } else {

                // DIVSL.L <ea>,Dr:Dq   (32-bit dividend)
                if (dl.raw == dh.raw && str.style.syntax == Syntax::MUSASHI) {
                    str << Sz<S>{} << str.tab << src << Sep{} << dh;
                } else {
                    str << "l" << Sz<S>{} << str.tab << src << Sep{} << dh << fill << dl;

                }
            }
            str << Av<I, M, S>{};
    }
}